

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_iterator_suite.cpp
# Opt level: O3

void pre_decrement_suite::test_integer(void)

{
  bool bVar1;
  pointer this;
  pointer this_00;
  iterator where;
  variable data;
  undefined1 local_70 [24];
  undefined1 local_58 [28];
  undefined4 local_3c;
  type local_38;
  undefined1 local_18;
  
  local_18 = 6;
  local_38._0_4_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_58,(pointer)&local_38.__align,false);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_70,(pointer)&local_38.__align,false);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::
          iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
          ::equals((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                    *)local_58,(iterator *)local_70);
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x489,"void pre_decrement_suite::test_integer()",bVar1);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_70 + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::operator--((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_58);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_70,(pointer)&local_38.__align,false);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::
          iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
          ::equals((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                    *)local_58,(iterator *)local_70);
  boost::detail::test_impl
            ("where != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x48b,"void pre_decrement_suite::test_integer()",!bVar1);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_70 + 8));
  this = trial::dynamic::basic_variable<std::allocator<char>_>::
         iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
         ::operator->((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       *)local_58);
  local_70._0_8_ = trial::dynamic::basic_variable<std::allocator<char>_>::size(this);
  local_3c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("where->size()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x48c,"void pre_decrement_suite::test_integer()",local_70,&local_3c);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_58 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_38.__align);
  local_18 = 6;
  local_38._0_4_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_58,(pointer)&local_38.__align,false);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_70,(pointer)&local_38.__align,false);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::
          iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
          ::equals((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                    *)local_58,(const_iterator *)local_70);
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x491,"void pre_decrement_suite::test_integer()",bVar1);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>const*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>const*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>const*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_const_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>const*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>const*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>const*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_const_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>const*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>const*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>const*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_const_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_70 + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::operator--((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_58);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_70,(pointer)&local_38.__align,false);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::
          iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
          ::equals((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                    *)local_58,(const_iterator *)local_70);
  boost::detail::test_impl
            ("where != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x493,"void pre_decrement_suite::test_integer()",!bVar1);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>const*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>const*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>const*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_const_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>const*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>const*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>const*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_const_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>const*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>const*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>const*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_const_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_70 + 8));
  this_00 = trial::dynamic::basic_variable<std::allocator<char>_>::
            iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
            ::operator->((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                          *)local_58);
  local_70._0_8_ = trial::dynamic::basic_variable<std::allocator<char>_>::size(this_00);
  local_3c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("where->size()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x494,"void pre_decrement_suite::test_integer()",local_70,&local_3c);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>const*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>const*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>const*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_const_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>const*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>const*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>const*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_const_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>const*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>const*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>const*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_const_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_58 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_38.__align);
  return;
}

Assistant:

void test_integer()
{
    {
        variable data(2);
        variable::iterator where = data.end();
        TRIAL_PROTOCOL_TEST(where == data.end());
        --where;
        TRIAL_PROTOCOL_TEST(where != data.end());
        TRIAL_PROTOCOL_TEST_EQUAL(where->size(), 1);
    }
    {
        const variable data(2);
        variable::const_iterator where = data.end();
        TRIAL_PROTOCOL_TEST(where == data.end());
        --where;
        TRIAL_PROTOCOL_TEST(where != data.end());
        TRIAL_PROTOCOL_TEST_EQUAL(where->size(), 1);
    }
}